

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void curses_print_message_core(wchar_t turn,char *msg,nh_bool canblock)

{
  char *pcVar1;
  char **wrap_output;
  wchar_t wVar2;
  size_t sVar3;
  size_t sVar4;
  wchar_t wVar5;
  int iVar6;
  short sVar7;
  wchar_t wVar8;
  undefined7 in_register_00000011;
  wchar_t wVar9;
  message *pmVar10;
  wchar_t wVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  char (*pacVar15) [81];
  bool bVar16;
  wchar_t output_count;
  char *local_60;
  undefined4 local_54;
  char **output;
  long local_48;
  message *local_40;
  ulong local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000011,canblock);
  local_60 = msg;
  if (msghistory == (message *)0x0) {
    alloc_hist_array();
  }
  wVar9 = histsize;
  pmVar10 = msghistory;
  if ((turn < prevturn) && (msghistory != (message *)0x0)) {
    wVar11 = L'\0';
    while ((wVar2 = histpos, lVar13 = (long)histpos, turn <= pmVar10[lVar13].turn &&
           (wVar11 < wVar9))) {
      pmVar10[lVar13].turn = 0;
      pcVar1 = pmVar10[lVar13].msg;
      if (pcVar1 != (char *)0x0) {
        free(pcVar1);
        pmVar10[lVar13].msg = (char *)0x0;
      }
      wVar11 = wVar11 + L'\x01';
      wVar8 = wVar9;
      if (L'\0' < wVar2) {
        wVar8 = L'\0';
      }
      histpos = wVar2 + wVar8 + L'\xffffffff';
    }
    curline = L'\0';
    for (lVar13 = 0; lVar13 != 0xca8; lVar13 = lVar13 + 0x51) {
      msglines[0][lVar13] = '\0';
    }
    wVar11 = L'\0';
    do {
      local_38 = (ulong)(uint)histpos;
      local_48 = (long)curline;
      lVar13 = local_48 * 0x51;
      pacVar15 = msglines + local_48;
      local_40 = msghistory;
      pmVar10 = msghistory;
      wVar2 = prevturn;
      wVar8 = wVar11;
      while( true ) {
        do {
          wVar11 = wVar8 + L'\x01';
          if (wVar9 <= wVar8) goto LAB_0010e2ff;
          wVar5 = (int)local_38 + wVar11;
          wVar8 = wVar9;
          if (wVar5 < wVar9) {
            wVar8 = L'\0';
          }
          iVar6 = wVar5 - wVar8;
          pcVar1 = pmVar10[iVar6].msg;
          wVar8 = wVar11;
        } while (pcVar1 == (char *)0x0);
        wVar5 = pmVar10[iVar6].turn;
        if (wVar2 < wVar5) {
          start_of_turn_curline = (wchar_t)local_48;
          last_redraw_curline = start_of_turn_curline;
        }
        prevturn = wVar5;
        sVar3 = strlen(*pacVar15);
        sVar4 = strlen(pcVar1);
        if (0x4f < sVar4 + sVar3 + 2) break;
        if ((*pacVar15)[0] != '\0') {
          sVar3 = strlen(*pacVar15);
          (*pacVar15 + sVar3)[0] = ' ';
          (*pacVar15 + sVar3)[1] = ' ';
          *(undefined1 *)(lVar13 + 0x1319b2 + sVar3) = 0;
        }
        strcat(*pacVar15,pcVar1);
        pmVar10 = local_40;
        wVar2 = wVar5;
      }
      ui_wrap_text(L'P',pcVar1,&output_count,&output);
      wrap_output = output;
      wVar9 = output_count;
      if (output_count < L'\x01') {
        wVar9 = L'\0';
      }
      for (uVar14 = 0; (uint)wVar9 != uVar14; uVar14 = uVar14 + 1) {
        lVar13 = (long)curline;
        if (msglines[lVar13][0] != '\0') {
          newline();
          lVar13 = (long)curline;
        }
        strcpy(msglines[lVar13],wrap_output[uVar14]);
      }
      ui_free_wrap(wrap_output);
      wVar9 = histsize;
    } while( true );
  }
LAB_0010e2ff:
  pcVar1 = local_60;
  wVar9 = action;
  if (*local_60 == '\0') {
    return;
  }
  if (prevaction < action) {
    skip_more = 0;
    newline();
  }
  prevaction = wVar9;
  prevturn = turn;
  store_message(turn,pcVar1);
  if (msgwin == (WINDOW *)0x0) {
    wVar9 = L'\xffffffff';
  }
  else {
    sVar7 = 0x4e;
    if (msgwin->_maxx < 0x4e) {
      sVar7 = msgwin->_maxx;
    }
    wVar9 = (short)(sVar7 + 1) + L'\xfffffff8';
    if (msgwin->_maxy != 0) {
      wVar9 = (int)(short)(sVar7 + 1);
    }
  }
  lVar13 = (long)curline;
  pacVar15 = msglines + lVar13;
  if (settings.msg_per_line == '\0') {
    sVar3 = strlen(*pacVar15);
    sVar4 = strlen(pcVar1);
    bVar16 = sVar4 + sVar3 + 2 < (ulong)(long)wVar9;
  }
  else {
    bVar16 = (*pacVar15)[0] == '\0';
  }
  iVar6 = strncmp(pcVar1,"You die",7);
  if ((bVar16) && (iVar6 != 0)) {
    if (msglines[lVar13][0] != '\0') {
      sVar3 = strlen(*pacVar15);
      (*pacVar15 + sVar3)[0] = ' ';
      (*pacVar15 + sVar3)[1] = ' ';
      *(undefined1 *)(lVar13 * 0x51 + 0x1319b2 + sVar3) = 0;
    }
    strcat(*pacVar15,local_60);
  }
  else {
    ui_wrap_text(wVar9,local_60,&output_count,&output);
    uVar12 = 0;
    uVar14 = (ulong)(uint)output_count;
    if (output_count < L'\x01') {
      uVar14 = uVar12;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if (msglines[curline][0] != '\0') {
        if ((char)local_54 != '\0') {
          iVar6 = -3;
          if (msgwin != (WINDOW *)0x0) {
            iVar6 = msgwin->_maxy + -1;
          }
          if (iVar6 < ((curline - last_redraw_curline) + 0x28) % 0x28) {
            more();
            goto LAB_0010e4a0;
          }
        }
        newline();
      }
LAB_0010e4a0:
      strcpy(msglines[curline],output[uVar12]);
    }
    ui_free_wrap(output);
  }
  draw_msgwin();
  return;
}

Assistant:

static void curses_print_message_core(int turn, const char *msg, nh_bool canblock)
{
    int hsize, vsize, maxlen;
    nh_bool use_current_line, died;

    if (!msghistory)
	alloc_hist_array();

    if (turn < prevturn) /* going back in time can happen during replay */
	prune_messages(turn);

    if (!*msg)
	return; /* empty message. done. */

    if (action > prevaction) {
	/* re-enable output if it was stopped and start a new line */
	skip_more = FALSE;
	newline();
    }
    prevturn = turn;
    prevaction = action;

    store_message(turn, msg);

    /*
     * generally we want to put as many messages on one line as possible to
     * maximize space usage. A new line is begun after each player turn or if
     * more() is called via pause_messages(). "You die" also deserves its own line.
     *
     * If the message area is only one line high, space for "--More--" must be
     * reserved at the end of the line, otherwise  --More-- is shown on a new line.
     */
    getmaxyx(msgwin, vsize, hsize);
    maxlen = hsize;
    if (maxlen >= COLNO) maxlen = COLNO - 1;
    if (vsize == 1) maxlen -= 8; /* for "--More--" */

    if (settings.msg_per_line) {
	use_current_line = !msglines[curline][0];
    } else {
	use_current_line = (strlen(msglines[curline]) + strlen(msg) + 2 < maxlen);
    }
    died = !strncmp(msg, "You die", 7);
    if (use_current_line && !died) {
	if (msglines[curline][0])
	    strcat(msglines[curline], "  ");
	strcat(msglines[curline], msg);
    } else {
	int i, output_count;
	char **output;

	ui_wrap_text(maxlen, msg, &output_count, &output);

	for (i = 0; i < output_count; i++) {
	    if (msglines[curline][0]) {
		/*
		 * If we would scroll a message off the screen that
		 * the user hasn't had a chance to look at this redraw,
		 * then run more(), else newline().  Because the
		 * --More-- takes up a line by itself, we need to
		 * offset that by one line.  Thus, a message window of
		 * height 2 requires us to always show a --More-- even
		 * if we're on the first message of the redraw; with
		 * height 3, we can safely newline after the first
		 * line of messages but must --More-- after the
		 * second, etc.  getmaxy() gives the height of the window
		 * minus 1, which is why we only subtract 2 not 3.
		 */
		if (canblock &&
		    (curline + MAX_MSGLINES - last_redraw_curline) %
		    MAX_MSGLINES > getmaxy(msgwin) - 2)
		    more();
		else
		    newline();
	    }
	    strcpy(msglines[curline], output[i]);
	}

	ui_free_wrap(output);
    }

    draw_msgwin();
}